

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

SerializedReadCSVData *
duckdb::SerializedReadCSVData::Deserialize
          (SerializedReadCSVData *__return_storage_ptr__,Deserializer *deserializer)

{
  SerializedReadCSVData(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,100,"files",&__return_storage_ptr__->files);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0x65,"csv_types",&__return_storage_ptr__->csv_types);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x66,"csv_names",&__return_storage_ptr__->csv_names);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0x67,"return_types",&__return_storage_ptr__->return_types);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x68,"return_names",&__return_storage_ptr__->return_names);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0x69,"filename_col_idx",&__return_storage_ptr__->filename_col_idx);
  Deserializer::ReadProperty<duckdb::SerializedCSVReaderOptions>
            (deserializer,0x6a,"options",&__return_storage_ptr__->options);
  Deserializer::ReadProperty<duckdb::MultiFileReaderBindData>
            (deserializer,0x6b,"reader_bind",&__return_storage_ptr__->reader_bind);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnInfo,true>>
            (deserializer,0x6c,"column_info",&__return_storage_ptr__->column_info);
  return __return_storage_ptr__;
}

Assistant:

SerializedReadCSVData SerializedReadCSVData::Deserialize(Deserializer &deserializer) {
	SerializedReadCSVData result;
	deserializer.ReadPropertyWithDefault<vector<string>>(100, "files", result.files);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(101, "csv_types", result.csv_types);
	deserializer.ReadPropertyWithDefault<vector<string>>(102, "csv_names", result.csv_names);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(103, "return_types", result.return_types);
	deserializer.ReadPropertyWithDefault<vector<string>>(104, "return_names", result.return_names);
	deserializer.ReadPropertyWithDefault<idx_t>(105, "filename_col_idx", result.filename_col_idx);
	deserializer.ReadProperty<SerializedCSVReaderOptions>(106, "options", result.options);
	deserializer.ReadProperty<MultiFileReaderBindData>(107, "reader_bind", result.reader_bind);
	deserializer.ReadPropertyWithDefault<vector<ColumnInfo>>(108, "column_info", result.column_info);
	return result;
}